

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

void __thiscall
immutable::ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_>::~ref
          (ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *this)

{
  rrb_details::release<immutable::vector<char,false,5>>(this->ptr);
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }